

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O3

void __thiscall SubcommandProgram_Working_Test::TestBody(SubcommandProgram_Working_Test *this)

{
  bool bVar1;
  undefined8 uVar2;
  char *message;
  App *pAVar3;
  long lVar4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertHelper AStack_98;
  Message local_90;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> local_80;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_80.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&local_80.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"-d","");
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"start","");
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"-ffilename","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_SubcommandProgram).super_TApp.args,&local_80,&stack0xffffffffffffffe0);
  lVar4 = 0;
  do {
    if (local_30 + lVar4 != *(undefined1 **)((long)local_40 + lVar4)) {
      operator_delete(*(undefined1 **)((long)local_40 + lVar4));
    }
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x60);
  TApp::run((TApp *)this);
  local_90.ss_.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_80,"1","dummy",(int *)&local_90,
             &(this->super_SubcommandProgram).dummy);
  if (local_80.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (string)0x0) {
    testing::Message::Message(&local_90);
    if (local_80.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pAVar3 = (App *)0x15b2ac;
    }
    else {
      pAVar3 = *local_80.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x1c0,(char *)pAVar3);
    testing::internal::AssertHelper::operator=(&AStack_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&AStack_98);
    if (CONCAT44(local_90.ss_.ptr_._4_4_,local_90.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_90.ss_.ptr_._4_4_,local_90.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_90.ss_.ptr_._4_4_,local_90.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_80.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
            super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector
            (&local_80,&(this->super_SubcommandProgram).super_TApp.app.parsed_subcommands_);
  if (local_80.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_80.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    testing::internal::CmpHelperEQ<CLI::App*,CLI::App*>
              ((internal *)&local_90,"start","app.get_subcommands().at(0)",
               &(this->super_SubcommandProgram).start,
               local_80.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (local_80.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_90.ss_.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_80);
      if (local_88.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        message = "";
      }
      else {
        message = ((local_88.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
                 ,0x1c1,message);
      testing::internal::AssertHelper::operator=(&AStack_98,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&AStack_98);
      if (local_80.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_80.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0)) {
          (*(code *)*(pointer)((long)*local_80.
                                      super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
              ((internal *)&local_80,"\"filename\"","file",(char (*) [9])0x156b5e,
               &(this->super_SubcommandProgram).file);
    if (local_80.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ == (string)0x0) {
      testing::Message::Message(&local_90);
      if (local_80.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
          super__Vector_impl_data._M_finish == (pointer)0x0) {
        pAVar3 = (App *)0x15b2ac;
      }
      else {
        pAVar3 = *local_80.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
                 ,0x1c2,(char *)pAVar3);
      testing::internal::AssertHelper::operator=(&AStack_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&AStack_98);
      if (CONCAT44(local_90.ss_.ptr_._4_4_,local_90.ss_.ptr_._0_4_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(local_90.ss_.ptr_._4_4_,local_90.ss_.ptr_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_90.ss_.ptr_._4_4_,local_90.ss_.ptr_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_80.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
              super__Vector_impl_data._M_finish,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  uVar2 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
  __clang_call_terminate(uVar2);
}

Assistant:

TEST_F(SubcommandProgram, Working) {
    args = {"-d", "start", "-ffilename"};

    run();

    EXPECT_EQ(1, dummy);
    EXPECT_EQ(start, app.get_subcommands().at(0));
    EXPECT_EQ("filename", file);
}